

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O3

void Init_ADPCMATable(void)

{
  int *piVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  int *piVar4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  int iVar15;
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  long lVar8;
  
  auVar3 = _DAT_00172610;
  piVar4 = jedi_table;
  lVar5 = 0;
  do {
    uVar2 = steps[lVar5];
    lVar6 = 0;
    iVar18 = 0;
    iVar19 = 1;
    iVar20 = 2;
    iVar21 = 3;
    auVar7 = _DAT_00172620;
    auVar16 = _DAT_00172600;
    do {
      auVar17._12_4_ = iVar21 * 2 & 0xeU | 1;
      auVar14._4_4_ = uVar2;
      auVar14._0_4_ = uVar2;
      auVar14._8_4_ = uVar2;
      auVar14._12_4_ = uVar2;
      iVar13 = uVar2 * (iVar18 * 2 & 0xeU | 1);
      iVar15 = (int)((auVar14._8_8_ & 0xffffffff) * (ulong)(iVar20 * 2 & 0xeU | 1));
      auVar17._8_4_ = auVar17._12_4_;
      auVar17._0_8_ = 1;
      iVar22 = (iVar19 * 2 & 0xeU | 1) * uVar2;
      iVar23 = (int)((auVar17._8_8_ & 0xffffffff) * (ulong)uVar2);
      auVar14 = auVar16 ^ auVar3;
      auVar17 = auVar7 ^ auVar3;
      uVar9 = -(uint)(auVar14._4_4_ == -0x80000000 && auVar14._0_4_ < -0x7ffffff8);
      uVar10 = -(uint)(auVar14._8_4_ < -0x7ffffff8 && auVar14._12_4_ == -0x80000000);
      uVar11 = -(uint)(auVar17._0_4_ < -0x7ffffff8 && auVar17._4_4_ == -0x80000000);
      uVar12 = -(uint)(auVar17._8_4_ < -0x7ffffff8 && auVar17._12_4_ == -0x80000000);
      piVar1 = piVar4 + lVar6;
      *piVar1 = uVar9 - ((int)(((uint)(iVar13 >> 0x1f) >> 0x1d) + iVar13) >> 3 ^ uVar9);
      piVar1[1] = uVar10 - ((int)(((uint)(iVar22 >> 0x1f) >> 0x1d) + iVar22) >> 3 ^ uVar10);
      piVar1[2] = uVar11 - ((int)(((uint)(iVar15 >> 0x1f) >> 0x1d) + iVar15) >> 3 ^ uVar11);
      piVar1[3] = uVar12 - ((int)(((uint)(iVar23 >> 0x1f) >> 0x1d) + iVar23) >> 3 ^ uVar12);
      lVar6 = lVar6 + 4;
      lVar8 = auVar16._8_8_;
      auVar16._0_8_ = auVar16._0_8_ + 4;
      auVar16._8_8_ = lVar8 + 4;
      lVar8 = auVar7._8_8_;
      auVar7._0_8_ = auVar7._0_8_ + 4;
      auVar7._8_8_ = lVar8 + 4;
      iVar18 = iVar18 + 4;
      iVar19 = iVar19 + 4;
      iVar20 = iVar20 + 4;
      iVar21 = iVar21 + 4;
    } while (lVar6 != 0x10);
    lVar5 = lVar5 + 1;
    piVar4 = piVar4 + 0x10;
  } while (lVar5 != 0x31);
  return;
}

Assistant:

static void Init_ADPCMATable(void)
{
	int step, nib;

	for (step = 0; step < 49; step++)
	{
		/* loop over all nibbles and compute the difference */
		for (nib = 0; nib < 16; nib++)
		{
			int value = (2*(nib & 0x07) + 1) * steps[step] / 8;
			jedi_table[step*16 + nib] = (nib&0x08) ? -value : value;
		}
	}
}